

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

Variable resolve_var(Vm *vm,char *name,size_t length)

{
  long lVar1;
  Variable *pVVar2;
  undefined8 uStack_30;
  
  uStack_30 = 0x104a11;
  pVVar2 = resolve_name(vm,name,length);
  if (pVVar2 != (Variable *)0x0) {
    return *pVVar2;
  }
  lVar1 = -(length + 0x31 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x104a55;
  sprintf(&stack0xffffffffffffffd8 + lVar1,"Could not find variable with name %.*s",
          length & 0xffffffff,name);
  *(code **)((long)&uStack_30 + lVar1) = logic_and;
  error(&vm->compiler,&stack0xffffffffffffffd8 + lVar1);
}

Assistant:

static Variable resolve_var(Vm *vm, const char *name, size_t length) {
    Variable *variable = resolve_name(vm, name, length);

    if (variable != NULL) { return *variable; }

    char message[34 + length];
    sprintf(message, "Could not find variable with name %.*s", (int) length, name);
    error(&vm->compiler, message);

    // not reachable, but clang warnings are annoying
    Variable error;
    error.index = -1;
    error.frame_offset = -1;
    return error;
}